

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O1

StatusOr<unsigned_long> * __thiscall
google::protobuf::util::converter::DataPiece::StringToNumber<unsigned_long>
          (StatusOr<unsigned_long> *__return_storage_ptr__,DataPiece *this,
          _func_bool_StringPiece_unsigned_long_ptr *func)

{
  anon_union_16_8_b72e7a25_for_DataPiece_3 *this_00;
  long lVar1;
  char *pcVar2;
  StringPiece error_message;
  StringPiece error_message_00;
  char cVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  AlphaNum *in_R8;
  StringPiece SVar6;
  StringPiece error_message_01;
  StringPiece error_message_02;
  char *local_158;
  undefined8 local_150;
  AlphaNum local_128;
  AlphaNum local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_t sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Status local_a8;
  Status local_80;
  string local_58;
  unsigned_long local_38;
  unsigned_long result;
  
  this_00 = &this->field_2;
  lVar1 = (this->field_2).str_.size_;
  if ((lVar1 < 1) ||
     ((*(this_00->str_).data_ != ' ' &&
      (cVar3 = protobuf::internal::StringPiecePod::operator[](&this_00->str_,lVar1 + -1),
      cVar3 != ' ')))) {
    lVar1 = (this->field_2).str_.size_;
    if (lVar1 < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe6,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    SVar6.length_ = lVar1;
    SVar6.ptr_ = (this_00->str_).data_;
    bVar4 = (*func)(SVar6,&local_38);
    if (bVar4) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      __return_storage_ptr__->value_ = local_38;
      return __return_storage_ptr__;
    }
    local_158 = "\"";
    local_150 = 1;
    pcVar2 = (this->field_2).str_.data_;
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,pcVar2,pcVar2 + (this->field_2).str_.size_);
    local_128.piece_data_ = (char *)local_c8;
    local_128.piece_size_ = sStack_c0;
    local_f8.piece_data_ = "\"";
    local_f8.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_158,&local_128,&local_f8,in_R8);
    error_message_00.length_ = local_58._M_string_length;
    error_message_00.ptr_ = local_58._M_dataplus._M_p;
    if ((long)local_58._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_58._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_80,INVALID_ARGUMENT,error_message_00);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_80.error_code_ == OK) {
      error_message_02.length_ = 0x23;
      error_message_02.ptr_ = "Status::OK is not a valid argument.";
      Status::Status(&local_a8,INTERNAL,error_message_02);
      Status::operator=(&__return_storage_ptr__->status_,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.error_message_._M_dataplus._M_p != &local_a8.error_message_.field_2) {
        operator_delete(local_a8.error_message_._M_dataplus._M_p);
      }
    }
    else {
      Status::operator=(&__return_storage_ptr__->status_,&local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.error_message_._M_dataplus._M_p != &local_80.error_message_.field_2) {
      operator_delete(local_80.error_message_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    paVar5 = &local_b8;
    local_58._M_dataplus._M_p = (pointer)local_c8;
  }
  else {
    local_158 = "\"";
    local_150 = 1;
    local_128.piece_data_ = (char *)(this->field_2).i64_;
    local_128.piece_size_ = (this->field_2).str_.size_;
    local_f8.piece_data_ = "\"";
    local_f8.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_158,&local_128,&local_f8,in_R8);
    error_message.length_ = local_58._M_string_length;
    error_message.ptr_ = local_58._M_dataplus._M_p;
    if ((long)local_58._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_58._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_80,INVALID_ARGUMENT,error_message);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_80.error_code_ == OK) {
      error_message_01.length_ = 0x23;
      error_message_01.ptr_ = "Status::OK is not a valid argument.";
      Status::Status(&local_a8,INTERNAL,error_message_01);
      Status::operator=(&__return_storage_ptr__->status_,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.error_message_._M_dataplus._M_p != &local_a8.error_message_.field_2) {
        operator_delete(local_a8.error_message_._M_dataplus._M_p);
      }
    }
    else {
      Status::operator=(&__return_storage_ptr__->status_,&local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.error_message_._M_dataplus._M_p != &local_80.error_message_.field_2) {
      operator_delete(local_80.error_message_._M_dataplus._M_p);
    }
    paVar5 = &local_58.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar5) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::StringToNumber(bool (*func)(StringPiece,
                                                    To*)) const {
  if (str_.size() > 0 && (str_[0] == ' ' || str_[str_.size() - 1] == ' ')) {
    return InvalidArgument(StrCat("\"", str_, "\""));
  }
  To result;
  if (func(str_, &result)) return result;
  return InvalidArgument(StrCat("\"", std::string(str_), "\""));
}